

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

double __thiscall
despot::Function::ComputeConstrainedMinimum(Function *this,NamedVar *var,int value)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  invalid_argument *this_00;
  int iVar4;
  int c;
  int index;
  ulong uVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double local_f8;
  vector<int,_std::allocator<int>_> vec;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((ulong)((long)(var->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(var->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)value) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,"Variable ",&var->name_);
    std::operator+(&local_70,&local_90," cannot have value ");
    to_string<int>(&local_b0,value);
    std::operator+(&local_50,&local_70,&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vec,
                   &local_50,".");
    std::invalid_argument::invalid_argument(this_00,(string *)&vec);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = (*this->_vptr_Function[7])();
  uVar2 = (*this->_vptr_Function[9])(this);
  local_f8 = INFINITY;
  if (this->child_ == var) {
    uVar2 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
      uVar2 = 0;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      (*this->_vptr_Function[4])(this,(ulong)uVar2,(ulong)(uint)value);
      if (extraout_XMM0_Qa < local_f8) {
        (*this->_vptr_Function[4])(this,(ulong)uVar2,(ulong)(uint)value);
        local_f8 = extraout_XMM0_Qa_00;
      }
    }
  }
  else {
    uVar3 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      if ((this->parents_).
          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] == var) {
        iVar4 = (int)uVar3;
        goto LAB_001568e2;
      }
    }
    iVar4 = -1;
LAB_001568e2:
    uVar3 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    while (index = (int)uVar3, index != (int)uVar5) {
      Variable::ComputeIndexVec
                ((vector<int,_std::allocator<int>_> *)
                 &vec.super__Vector_base<int,_std::allocator<int>_>,&this->parents_,index);
      if ((iVar4 == -1) ||
         (vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [iVar4] == value)) {
        for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          (*this->_vptr_Function[4])(this,uVar3,(ulong)uVar1);
          if (extraout_XMM0_Qa_01 < local_f8) {
            (*this->_vptr_Function[4])(this,uVar3,(ulong)uVar1);
            local_f8 = extraout_XMM0_Qa_02;
          }
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      uVar3 = (ulong)(index + 1);
    }
  }
  return local_f8;
}

Assistant:

double Function::ComputeConstrainedMinimum(const NamedVar* var,
	int value) const {
	if (var->values().size() <= value)
		throw std::invalid_argument(
			"Variable " + var->name() + " cannot have value " + to_string(value)
				+ ".");

	// cout << "Computing constrained minimum (" << var->name() << " = " << value << ")" << endl;
	// cout << *this << endl;
	int parent_size = ParentSize();
	int child_size = ChildSize();
	double min = Globals::POS_INFTY;
	if (var == child_) {
		for (int p = 0; p < parent_size; p++)
			if (GetValue(p, value) < min)
				min = GetValue(p, value);
	} else {
		int id = -1;
		for (int i = 0; i < parent_size; i++)
			if (parents_[i] == var) {
				id = i;
				break;
			}

		for (int p = 0; p < parent_size; p++) {
			vector<int> vec = Variable::ComputeIndexVec(parents_, p);
			if (id == -1 || vec[id] == value) {
				for (int c = 0; c < child_size; c++) {
					if (GetValue(p, c) < min) {
						min = GetValue(p, c);
					}
				}
			}
		}
	}
	// cout << "min = " << min << endl;

	return min;
}